

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

void Vga_ManStop(Vta_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vta_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    uVar1 = sat_solver2_nvars(p->pSat);
    uVar2 = sat_solver2_nclauses(p->pSat);
    uVar3 = sat_solver2_nconflicts(p->pSat);
    uVar4 = sat_solver2_nlearnts(p->pSat);
    Abc_Print(1,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n"
              ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,p->pSat->nDBreduces,p->nCexes,
              p->nObjAdded);
  }
  Vec_VecFreeP((Vec_Vec_t **)&p->vCores);
  Vec_VecFreeP((Vec_Vec_t **)&p->vFrames);
  Vec_BitFreeP(&p->vSeenGla);
  Vec_IntFreeP(&p->vSeens);
  Vec_IntFreeP(&p->vOrder);
  Vec_IntFreeP(&p->vAddedNew);
  sat_solver2_delete(p->pSat);
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  if (p->pObjs != (Vta_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Vta_Obj_t *)0x0;
  }
  if (p != (Vta_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Vga_ManStop( Vta_Man_t * p )
{
    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), sat_solver2_nconflicts(p->pSat), 
            sat_solver2_nlearnts(p->pSat), p->pSat->nDBreduces, p->nCexes, p->nObjAdded );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vCores );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vFrames );
    Vec_BitFreeP( &p->vSeenGla );
    Vec_IntFreeP( &p->vSeens );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vAddedNew );
    sat_solver2_delete( p->pSat );
    ABC_FREE( p->pBins );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}